

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlmalloc.c
# Opt level: O2

void dlfree(void *mem)

{
  ulong uVar1;
  ulong uVar2;
  malloc_tree_chunk *pmVar3;
  malloc_tree_chunk *pmVar4;
  uint uVar5;
  char *pcVar6;
  malloc_tree_chunk **ppmVar7;
  int iVar8;
  ulong uVar9;
  mchunkptr pmVar10;
  byte bVar11;
  uint uVar12;
  mstate pmVar13;
  mstate pmVar14;
  size_t __len;
  long lVar15;
  mstate pmVar16;
  mstate m;
  long lVar17;
  mstate pmVar18;
  malloc_tree_chunk **ppmVar19;
  
  if (mem == (void *)0x0) {
    return;
  }
  m = (mstate)((long)mem + -0x10);
  if ((m < _gm_.least_addr) || (uVar1 = *(ulong *)((long)mem + -8), ((uint)uVar1 & 3) == 1))
  goto LAB_00105d51;
  uVar9 = uVar1 & 0xfffffffffffffff8;
  pmVar14 = (mstate)((long)m->smallbins + (uVar9 - 0x48));
  if ((uVar1 & 1) == 0) {
    uVar2 = *(ulong *)m;
    if ((uVar1 & 2) == 0) {
      __len = uVar9 + uVar2 + 0x20;
      iVar8 = munmap((void *)((long)m - uVar2),__len);
      if (iVar8 != 0) {
        return;
      }
      _gm_.footprint = _gm_.footprint - __len;
      return;
    }
    m = (mstate)((long)m - uVar2);
    if (m < _gm_.least_addr) goto LAB_00105d51;
    uVar9 = uVar9 + uVar2;
    if (m == (mstate)_gm_.dv) {
      if ((~(uint)pmVar14->dvsize & 3) == 0) {
        _gm_.dvsize = uVar9;
        pmVar14->dvsize = pmVar14->dvsize & 0xfffffffffffffffe;
        m->dvsize = uVar9 | 1;
        *(ulong *)pmVar14 = uVar9;
        return;
      }
    }
    else if (uVar2 < 0x100) {
      pmVar3 = (malloc_tree_chunk *)m->topsize;
      pmVar4 = (malloc_tree_chunk *)m->least_addr;
      if ((pmVar3 != (malloc_tree_chunk *)(_gm_.smallbins + (uVar2 >> 3) * 2)) &&
         ((pmVar3 < _gm_.least_addr || ((mstate)pmVar3->bk != m)))) goto LAB_00105d51;
      if (pmVar4 == pmVar3) {
        bVar11 = (byte)(uVar2 >> 3) & 0x1f;
        _gm_.smallmap = _gm_.smallmap & (-2 << bVar11 | 0xfffffffeU >> 0x20 - bVar11);
      }
      else {
        if ((pmVar4 != (malloc_tree_chunk *)(_gm_.smallbins + (uVar2 >> 3) * 2)) &&
           ((pmVar4 < _gm_.least_addr || ((mstate)pmVar4->fd != m)))) goto LAB_00105d51;
        pmVar3->bk = pmVar4;
        pmVar4->fd = pmVar3;
      }
    }
    else {
      pmVar16 = (mstate)m->least_addr;
      pmVar3 = (malloc_tree_chunk *)m->trim_check;
      if (pmVar16 == m) {
        if ((mstate)m->top == (mstate)0x0) {
          if ((mstate)m->dv == (mstate)0x0) {
            pmVar16 = (mstate)0x0;
            goto LAB_00105843;
          }
          pmVar13 = (mstate)m->dv;
          ppmVar7 = (malloc_tree_chunk **)&m->dv;
        }
        else {
          pmVar13 = (mstate)m->top;
          ppmVar7 = (malloc_tree_chunk **)&m->top;
        }
        do {
          do {
            ppmVar19 = ppmVar7;
            pmVar16 = pmVar13;
            pmVar13 = (mstate)pmVar16->top;
            ppmVar7 = (malloc_tree_chunk **)&pmVar16->top;
          } while ((mstate)pmVar16->top != (mstate)0x0);
          pmVar13 = (mstate)pmVar16->dv;
          ppmVar7 = (malloc_tree_chunk **)&pmVar16->dv;
        } while ((mstate)pmVar16->dv != (mstate)0x0);
        if (ppmVar19 < _gm_.least_addr) goto LAB_00105d51;
        *ppmVar19 = (malloc_tree_chunk *)0x0;
      }
      else {
        pmVar4 = (malloc_tree_chunk *)m->topsize;
        if (((pmVar4 < _gm_.least_addr) || ((mstate)pmVar4->bk != m)) ||
           ((mstate)pmVar16->topsize != m)) goto LAB_00105d51;
        pmVar4->bk = (malloc_tree_chunk *)pmVar16;
        pmVar16->topsize = (size_t)pmVar4;
      }
LAB_00105843:
      if (pmVar3 != (malloc_tree_chunk *)0x0) {
        uVar12 = (uint)m->release_checks;
        if (m == (mstate)_gm_.treebins[uVar12]) {
          _gm_.treebins[uVar12] = (tbinptr)pmVar16;
          if (pmVar16 == (mstate)0x0) {
            bVar11 = (byte)uVar12 & 0x1f;
            _gm_.treemap = _gm_.treemap & (-2 << bVar11 | 0xfffffffeU >> 0x20 - bVar11);
          }
          else {
LAB_0010588f:
            pcVar6 = _gm_.least_addr;
            if (pmVar16 < _gm_.least_addr) goto LAB_00105d51;
            pmVar16->trim_check = (size_t)pmVar3;
            pmVar3 = (malloc_tree_chunk *)m->dv;
            if (pmVar3 != (malloc_tree_chunk *)0x0) {
              if (pmVar3 < pcVar6) goto LAB_00105d51;
              pmVar16->dv = (mchunkptr)pmVar3;
              pmVar3->parent = (malloc_tree_chunk *)pmVar16;
            }
            pmVar10 = m->top;
            if (pmVar10 != (mchunkptr)0x0) {
              if (pmVar10 < pcVar6) goto LAB_00105d51;
              pmVar16->top = pmVar10;
              pmVar10[1].fd = (malloc_chunk *)pmVar16;
            }
          }
        }
        else {
          if (pmVar3 < _gm_.least_addr) goto LAB_00105d51;
          pmVar3->child[(mstate)pmVar3->child[0] != m] = (malloc_tree_chunk *)pmVar16;
          if (pmVar16 != (mstate)0x0) goto LAB_0010588f;
        }
      }
    }
  }
  if ((pmVar14 <= m) || (uVar1 = pmVar14->dvsize, (uVar1 & 1) == 0)) goto LAB_00105d51;
  if ((uVar1 & 2) == 0) {
    if (pmVar14 == (mstate)_gm_.top) {
      uVar9 = uVar9 + _gm_.topsize;
      _gm_.topsize = uVar9;
      _gm_.top = (mchunkptr)m;
      m->dvsize = uVar9 | 1;
      if (m == (mstate)_gm_.dv) {
        _gm_.dv = (mchunkptr)0x0;
        _gm_.dvsize = 0;
      }
      if (uVar9 <= _gm_.trim_check) {
        return;
      }
      sys_trim((mstate)0x0,0xfffffffffffffffe);
      return;
    }
    if (pmVar14 == (mstate)_gm_.dv) {
      uVar9 = uVar9 + _gm_.dvsize;
      _gm_.dvsize = uVar9;
      _gm_.dv = (mchunkptr)m;
      m->dvsize = uVar9 | 1;
      *(ulong *)((long)m->smallbins + (uVar9 - 0x48)) = uVar9;
      return;
    }
    if (uVar1 < 0x100) {
      pmVar3 = (malloc_tree_chunk *)pmVar14->topsize;
      pmVar4 = (malloc_tree_chunk *)pmVar14->least_addr;
      if ((pmVar3 != (malloc_tree_chunk *)(_gm_.smallbins + (uVar1 >> 3) * 2)) &&
         ((pmVar3 < _gm_.least_addr || ((mstate)pmVar3->bk != pmVar14)))) goto LAB_00105d51;
      if (pmVar4 == pmVar3) {
        bVar11 = (byte)(uVar1 >> 3) & 0x1f;
        _gm_.smallmap = _gm_.smallmap & (-2 << bVar11 | 0xfffffffeU >> 0x20 - bVar11);
      }
      else {
        if ((pmVar4 != (malloc_tree_chunk *)(_gm_.smallbins + (uVar1 >> 3) * 2)) &&
           ((pmVar4 < _gm_.least_addr || ((mstate)pmVar4->fd != pmVar14)))) goto LAB_00105d51;
        pmVar3->bk = pmVar4;
        pmVar4->fd = pmVar3;
      }
    }
    else {
      pmVar16 = (mstate)pmVar14->least_addr;
      pmVar3 = (malloc_tree_chunk *)pmVar14->trim_check;
      if (pmVar16 == pmVar14) {
        if ((mstate)pmVar14->top == (mstate)0x0) {
          if ((mstate)pmVar14->dv == (mstate)0x0) {
            pmVar16 = (mstate)0x0;
            goto LAB_00105c83;
          }
          pmVar13 = (mstate)pmVar14->dv;
          ppmVar7 = (malloc_tree_chunk **)&pmVar14->dv;
        }
        else {
          pmVar13 = (mstate)pmVar14->top;
          ppmVar7 = (malloc_tree_chunk **)&pmVar14->top;
        }
        do {
          do {
            ppmVar19 = ppmVar7;
            pmVar16 = pmVar13;
            pmVar13 = (mstate)pmVar16->top;
            ppmVar7 = (malloc_tree_chunk **)&pmVar16->top;
          } while ((mstate)pmVar16->top != (mstate)0x0);
          pmVar13 = (mstate)pmVar16->dv;
          ppmVar7 = (malloc_tree_chunk **)&pmVar16->dv;
        } while ((mstate)pmVar16->dv != (mstate)0x0);
        if (ppmVar19 < _gm_.least_addr) goto LAB_00105d51;
        *ppmVar19 = (malloc_tree_chunk *)0x0;
      }
      else {
        pmVar4 = (malloc_tree_chunk *)pmVar14->topsize;
        if (((pmVar4 < _gm_.least_addr) || ((mstate)pmVar4->bk != pmVar14)) ||
           ((mstate)pmVar16->topsize != pmVar14)) goto LAB_00105d51;
        pmVar4->bk = (malloc_tree_chunk *)pmVar16;
        pmVar16->topsize = (size_t)pmVar4;
      }
LAB_00105c83:
      if (pmVar3 != (malloc_tree_chunk *)0x0) {
        uVar12 = (uint)pmVar14->release_checks;
        if (pmVar14 == (mstate)_gm_.treebins[uVar12]) {
          _gm_.treebins[uVar12] = (tbinptr)pmVar16;
          if (pmVar16 == (mstate)0x0) {
            bVar11 = (byte)uVar12 & 0x1f;
            _gm_.treemap = _gm_.treemap & (-2 << bVar11 | 0xfffffffeU >> 0x20 - bVar11);
          }
          else {
LAB_00105ccf:
            pcVar6 = _gm_.least_addr;
            if (pmVar16 < _gm_.least_addr) goto LAB_00105d51;
            pmVar16->trim_check = (size_t)pmVar3;
            pmVar3 = (malloc_tree_chunk *)pmVar14->dv;
            if (pmVar3 != (malloc_tree_chunk *)0x0) {
              if (pmVar3 < pcVar6) goto LAB_00105d51;
              pmVar16->dv = (mchunkptr)pmVar3;
              pmVar3->parent = (malloc_tree_chunk *)pmVar16;
            }
            pmVar10 = pmVar14->top;
            if (pmVar10 != (mchunkptr)0x0) {
              if (pmVar10 < pcVar6) goto LAB_00105d51;
              pmVar16->top = pmVar10;
              pmVar10[1].fd = (malloc_chunk *)pmVar16;
            }
          }
        }
        else {
          if (pmVar3 < _gm_.least_addr) goto LAB_00105d51;
          pmVar3->child[(mstate)pmVar3->child[0] != pmVar14] = (malloc_tree_chunk *)pmVar16;
          if (pmVar16 != (mstate)0x0) goto LAB_00105ccf;
        }
      }
    }
    uVar9 = uVar9 + (uVar1 & 0xfffffffffffffff8);
    m->dvsize = uVar9 | 1;
    *(ulong *)((long)m->smallbins + (uVar9 - 0x48)) = uVar9;
    if (m == (mstate)_gm_.dv) {
      _gm_.dvsize = uVar9;
      return;
    }
  }
  else {
    pmVar14->dvsize = uVar1 & 0xfffffffffffffffe;
    m->dvsize = uVar9 | 1;
    *(ulong *)((long)m->smallbins + (uVar9 - 0x48)) = uVar9;
  }
  if (uVar9 < 0x100) {
    uVar9 = uVar9 >> 3;
    if ((_gm_.smallmap >> ((uint)uVar9 & 0x1f) & 1) == 0) {
      _gm_.smallmap = _gm_.smallmap | 1 << ((byte)uVar9 & 0x1f);
      pmVar10 = (mchunkptr)(_gm_.smallbins + uVar9 * 2);
    }
    else {
      pmVar10 = _gm_.smallbins[uVar9 * 2 + 2];
      if (_gm_.smallbins[uVar9 * 2 + 2] < _gm_.least_addr) {
LAB_00105d51:
        abort();
      }
    }
    _gm_.smallbins[uVar9 * 2 + 2] = (mchunkptr)m;
    pmVar10->bk = (malloc_chunk *)m;
    m->topsize = (size_t)pmVar10;
    m->least_addr = (char *)(_gm_.smallbins + uVar9 * 2);
  }
  else {
    uVar12 = (uint)(uVar9 >> 8);
    if (uVar12 == 0) {
      uVar12 = 0;
    }
    else if (uVar12 < 0x10000) {
      uVar5 = 0x1f;
      if (uVar12 != 0) {
        for (; uVar12 >> uVar5 == 0; uVar5 = uVar5 - 1) {
        }
      }
      uVar12 = (uint)((uVar9 >> ((ulong)(byte)(0x26 - (char)(uVar5 ^ 0x1f)) & 0x3f) & 1) != 0) +
               (uVar5 ^ 0x1f) * 2 ^ 0x3e;
    }
    else {
      uVar12 = 0x1f;
    }
    pmVar14 = (mstate)(_gm_.treebins + uVar12);
    *(uint *)&m->release_checks = uVar12;
    m->dv = (mchunkptr)0x0;
    m->top = (mchunkptr)0x0;
    if ((_gm_.treemap >> (uVar12 & 0x1f) & 1) == 0) {
      _gm_.treemap = _gm_.treemap | 1 << ((byte)uVar12 & 0x1f);
      pmVar16 = pmVar14;
    }
    else {
      bVar11 = 0x39 - (char)(uVar12 >> 1);
      if (uVar12 == 0x1f) {
        bVar11 = 0;
      }
      lVar15 = uVar9 << (bVar11 & 0x3f);
      pmVar14 = *(mstate *)pmVar14;
      do {
        pmVar13 = pmVar14;
        if ((pmVar13->dvsize & 0xfffffffffffffff8) == uVar9) {
          if ((pmVar13 < _gm_.least_addr) ||
             (pmVar16 = (mstate)pmVar13->topsize, pmVar16 < _gm_.least_addr)) goto LAB_00105d51;
          pmVar14 = (mstate)&pmVar13->topsize;
          pmVar16->least_addr = (char *)m;
          lVar15 = 0x30;
          lVar17 = 0x10;
          pmVar18 = (mstate)0x0;
          goto LAB_00105c03;
        }
        lVar17 = lVar15 >> 0x3f;
        lVar15 = lVar15 * 2;
        pmVar14 = *(mstate *)((long)pmVar13 + lVar17 * -8 + 0x20);
      } while (pmVar14 != (mstate)0x0);
      pmVar14 = (mstate)((long)pmVar13 + lVar17 * -8 + 0x20);
      pmVar16 = pmVar13;
      if (pmVar14 < _gm_.least_addr) goto LAB_00105d51;
    }
    lVar17 = 0x30;
    lVar15 = 0x10;
    pmVar13 = m;
    pmVar18 = m;
LAB_00105c03:
    *(mstate *)pmVar14 = m;
    *(mstate *)((long)m->smallbins + lVar17 + -0x48) = pmVar16;
    m->least_addr = (char *)pmVar13;
    *(mstate *)((long)m->smallbins + lVar15 + -0x48) = pmVar18;
    _gm_.release_checks = _gm_.release_checks - 1;
    if (_gm_.release_checks == 0) {
      release_unused_segments(m);
      return;
    }
  }
  return;
}

Assistant:

void dlfree(void* mem) {
  /*
     Consolidate freed chunks with preceeding or succeeding bordering
     free chunks, if they exist, and then place in a bin.  Intermixed
     with special cases for top, dv, mmapped chunks, and usage errors.
  */

  if (mem != 0) {
    mchunkptr p  = mem2chunk(mem);
#if FOOTERS
    mstate fm = get_mstate_for(p);
    if (!ok_magic(fm)) {
      USAGE_ERROR_ACTION(fm, p);
      return;
    }
#else /* FOOTERS */
#define fm gm
#endif /* FOOTERS */
    if (!PREACTION(fm)) {
      check_inuse_chunk(fm, p);
      if (RTCHECK(ok_address(fm, p) && ok_inuse(p))) {
        size_t psize = chunksize(p);
        mchunkptr next = chunk_plus_offset(p, psize);
        if (!pinuse(p)) {
          size_t prevsize = p->prev_foot;
          if (is_mmapped(p)) {
            psize += prevsize + MMAP_FOOT_PAD;
            if (CALL_MUNMAP((char*)p - prevsize, psize) == 0)
              fm->footprint -= psize;
            goto postaction;
          }
          else {
            mchunkptr prev = chunk_minus_offset(p, prevsize);
            psize += prevsize;
            p = prev;
            if (RTCHECK(ok_address(fm, prev))) { /* consolidate backward */
              if (p != fm->dv) {
                unlink_chunk(fm, p, prevsize);
              }
              else if ((next->head & INUSE_BITS) == INUSE_BITS) {
                fm->dvsize = psize;
                set_free_with_pinuse(p, psize, next);
                goto postaction;
              }
            }
            else
              goto erroraction;
          }
        }

        if (RTCHECK(ok_next(p, next) && ok_pinuse(next))) {
          if (!cinuse(next)) {  /* consolidate forward */
            if (next == fm->top) {
              size_t tsize = fm->topsize += psize;
              fm->top = p;
              p->head = tsize | PINUSE_BIT;
              if (p == fm->dv) {
                fm->dv = 0;
                fm->dvsize = 0;
              }
              if (should_trim(fm, tsize))
                sys_trim(fm, 0);
              goto postaction;
            }
            else if (next == fm->dv) {
              size_t dsize = fm->dvsize += psize;
              fm->dv = p;
              set_size_and_pinuse_of_free_chunk(p, dsize);
              goto postaction;
            }
            else {
              size_t nsize = chunksize(next);
              psize += nsize;
              unlink_chunk(fm, next, nsize);
              set_size_and_pinuse_of_free_chunk(p, psize);
              if (p == fm->dv) {
                fm->dvsize = psize;
                goto postaction;
              }
            }
          }
          else
            set_free_with_pinuse(p, psize, next);

          if (is_small(psize)) {
            insert_small_chunk(fm, p, psize);
            check_free_chunk(fm, p);
          }
          else {
            tchunkptr tp = (tchunkptr)p;
            insert_large_chunk(fm, tp, psize);
            check_free_chunk(fm, p);
            if (--fm->release_checks == 0)
              release_unused_segments(fm);
          }
          goto postaction;
        }
      }
    erroraction:
      USAGE_ERROR_ACTION(fm, p);
    postaction:
      POSTACTION(fm);
    }
  }
#if !FOOTERS
#undef fm
#endif /* FOOTERS */
}